

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

ModuleLayoutSection
spvtools::val::anon_unknown_11::InstructionLayoutSection(ModuleLayoutSection current_section,Op op)

{
  int32_t iVar1;
  Op op_local;
  ModuleLayoutSection current_section_local;
  
  iVar1 = spvOpcodeGeneratesType(op);
  if ((iVar1 != 0) || (iVar1 = spvOpcodeIsConstant(op), iVar1 != 0)) {
    return kLayoutTypes;
  }
  if (op == OpUndef) {
LAB_00bed393:
    if (current_section != kLayoutTypes) {
      return kLayoutFunctionDefinitions;
    }
    return kLayoutTypes;
  }
  if (2 < op - OpSourceContinued) {
    if (op - OpName < 2) {
      return kLayoutDebug2;
    }
    if (op != OpString) {
      if (op != OpLine) {
        if (op == OpExtension) {
          return kLayoutExtensions;
        }
        if (op == OpExtInstImport) {
          return kLayoutExtInstImport;
        }
        if (op == OpExtInst) {
LAB_00bed37b:
          if (current_section != kLayoutTypes) {
            return kLayoutFunctionDefinitions;
          }
          return kLayoutTypes;
        }
        if (op == OpMemoryModel) {
          return kLayoutMemoryModel;
        }
        if (op == OpEntryPoint) {
          return kLayoutEntryPoint;
        }
        if (op == OpExecutionMode) {
          return kLayoutExecutionMode;
        }
        if (op == OpCapability) {
          return kLayoutCapabilities;
        }
        if (op == OpTypeForwardPointer) {
          return kLayoutTypes;
        }
        if (op - OpFunction < 3) {
          if (current_section != kLayoutFunctionDeclarations) {
            return kLayoutFunctionDefinitions;
          }
          return kLayoutFunctionDeclarations;
        }
        if (op == OpVariable) {
LAB_00bed363:
          if (current_section != kLayoutTypes) {
            return kLayoutFunctionDefinitions;
          }
          return kLayoutTypes;
        }
        if (4 < op - OpDecorate) {
          if (op == OpNoLine) goto LAB_00bed393;
          if (op == OpModuleProcessed) {
            return kLayoutDebug3;
          }
          if (op == OpExecutionModeId) {
            return kLayoutExecutionMode;
          }
          if (op != OpDecorateId) {
            if (op == OpUntypedVariableKHR) goto LAB_00bed363;
            if (op == OpExtInstWithForwardRefsKHR) goto LAB_00bed37b;
            if (op == OpSamplerImageAddressingModeNV) {
              return kLayoutSamplerImageAddressMode;
            }
            if (1 < op - OpDecorateString) {
              return kLayoutFunctionDefinitions;
            }
          }
        }
        return kLayoutAnnotations;
      }
      goto LAB_00bed393;
    }
  }
  return kLayoutDebug1;
}

Assistant:

ModuleLayoutSection InstructionLayoutSection(
    ModuleLayoutSection current_section, spv::Op op) {
  // See Section 2.4
  if (spvOpcodeGeneratesType(op) || spvOpcodeIsConstant(op))
    return kLayoutTypes;

  switch (op) {
    case spv::Op::OpCapability:
      return kLayoutCapabilities;
    case spv::Op::OpExtension:
      return kLayoutExtensions;
    case spv::Op::OpExtInstImport:
      return kLayoutExtInstImport;
    case spv::Op::OpMemoryModel:
      return kLayoutMemoryModel;
    case spv::Op::OpEntryPoint:
      return kLayoutEntryPoint;
    case spv::Op::OpExecutionMode:
    case spv::Op::OpExecutionModeId:
      return kLayoutExecutionMode;
    case spv::Op::OpSourceContinued:
    case spv::Op::OpSource:
    case spv::Op::OpSourceExtension:
    case spv::Op::OpString:
      return kLayoutDebug1;
    case spv::Op::OpName:
    case spv::Op::OpMemberName:
      return kLayoutDebug2;
    case spv::Op::OpModuleProcessed:
      return kLayoutDebug3;
    case spv::Op::OpDecorate:
    case spv::Op::OpMemberDecorate:
    case spv::Op::OpGroupDecorate:
    case spv::Op::OpGroupMemberDecorate:
    case spv::Op::OpDecorationGroup:
    case spv::Op::OpDecorateId:
    case spv::Op::OpDecorateStringGOOGLE:
    case spv::Op::OpMemberDecorateStringGOOGLE:
      return kLayoutAnnotations;
    case spv::Op::OpTypeForwardPointer:
      return kLayoutTypes;
    case spv::Op::OpVariable:
    case spv::Op::OpUntypedVariableKHR:
      if (current_section == kLayoutTypes) return kLayoutTypes;
      return kLayoutFunctionDefinitions;
    case spv::Op::OpExtInst:
    case spv::Op::OpExtInstWithForwardRefsKHR:
      // spv::Op::OpExtInst is only allowed in types section for certain
      // extended instruction sets. This will be checked separately.
      if (current_section == kLayoutTypes) return kLayoutTypes;
      return kLayoutFunctionDefinitions;
    case spv::Op::OpLine:
    case spv::Op::OpNoLine:
    case spv::Op::OpUndef:
      if (current_section == kLayoutTypes) return kLayoutTypes;
      return kLayoutFunctionDefinitions;
    case spv::Op::OpFunction:
    case spv::Op::OpFunctionParameter:
    case spv::Op::OpFunctionEnd:
      if (current_section == kLayoutFunctionDeclarations)
        return kLayoutFunctionDeclarations;
      return kLayoutFunctionDefinitions;
    case spv::Op::OpSamplerImageAddressingModeNV:
      return kLayoutSamplerImageAddressMode;
    default:
      break;
  }
  return kLayoutFunctionDefinitions;
}